

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_22460c::BNTest_ASC2BN_Test::TestBody(BNTest_ASC2BN_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  pointer pbVar4;
  char *in_R9;
  string local_6e8;
  AssertHelper local_6c8;
  Message local_6c0;
  bool local_6b1;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_680;
  Message local_678;
  int local_66c;
  undefined1 local_668 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_638;
  Message local_630;
  undefined1 local_628 [8];
  AssertionResult gtest_ar__21;
  string local_610;
  AssertHelper local_5f0;
  Message local_5e8;
  bool local_5d9;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_5a8;
  Message local_5a0;
  int local_594;
  undefined1 local_590 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_560;
  Message local_558;
  undefined1 local_550 [8];
  AssertionResult gtest_ar__18;
  string local_538;
  AssertHelper local_518;
  Message local_510;
  bool local_501;
  undefined1 local_500 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_4d0;
  Message local_4c8;
  int local_4bc;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_488;
  Message local_480;
  undefined1 local_478 [8];
  AssertionResult gtest_ar__15;
  string local_460;
  AssertHelper local_440;
  Message local_438;
  bool local_429;
  undefined1 local_428 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_3f8;
  Message local_3f0;
  int local_3e4;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_3b0;
  Message local_3a8;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar__12;
  string local_388;
  AssertHelper local_368;
  Message local_360;
  bool local_351;
  undefined1 local_350 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_320;
  Message local_318;
  int local_30c;
  undefined1 local_308 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_2d8;
  Message local_2d0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__9;
  string local_2b0;
  AssertHelper local_290;
  Message local_288;
  int local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_248;
  Message local_240;
  int local_234;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_200;
  Message local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__6;
  string local_1d8;
  AssertHelper local_1b8;
  Message local_1b0;
  bool local_1a1;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_170;
  Message local_168;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__3;
  string local_100;
  AssertHelper local_e0;
  Message local_d8;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_98;
  Message local_90;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar__1;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<BIGNUM> bn;
  BNTest_ASC2BN_Test *this_local;
  
  ASCIIToBIGNUM((anon_unknown_dwarf_22460c *)&gtest_ar_.message_,"0");
  testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x84bde6,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x4ba,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_84 = BN_is_zero(pbVar4);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_80,&local_84,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_80,
                 (AssertionResult *)"BN_is_zero(bn.get())","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4bb,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    iVar2 = BN_is_negative(pbVar4);
    local_c9 = iVar2 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_c8,&local_c9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar1) {
      testing::Message::Message(&local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_100,(internal *)local_c8,(AssertionResult *)0x84bce9,"true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4bc,pcVar3);
      testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      testing::Message::~Message(&local_d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    ASCIIToBIGNUM((anon_unknown_dwarf_22460c *)&gtest_ar__3.message_,"256");
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::operator=
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
               (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
    testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_118,
               (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__4.message_,(internal *)local_118,(AssertionResult *)0x84bde6,
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4bf,pcVar3);
      testing::internal::AssertHelper::operator=(&local_128,&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
      testing::Message::~Message(&local_120);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      local_15c = BN_is_word(pbVar4,0x100);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_158,&local_15c,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
      if (!bVar1) {
        testing::Message::Message(&local_168);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__5.message_,(internal *)local_158,
                   (AssertionResult *)"BN_is_word(bn.get(), 256)","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x4c0,pcVar3);
        testing::internal::AssertHelper::operator=(&local_170,&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
        testing::Message::~Message(&local_168);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
      pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      iVar2 = BN_is_negative(pbVar4);
      local_1a1 = iVar2 == 0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1a0,&local_1a1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
      if (!bVar1) {
        testing::Message::Message(&local_1b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1d8,(internal *)local_1a0,(AssertionResult *)0x84bce9,"true","false",in_R9
                  );
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x4c1,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
        testing::internal::AssertHelper::~AssertHelper(&local_1b8);
        std::__cxx11::string::~string((string *)&local_1d8);
        testing::Message::~Message(&local_1b0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
      ASCIIToBIGNUM((anon_unknown_dwarf_22460c *)&gtest_ar__6.message_,"-42");
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::operator=
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
                 (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_);
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_);
      testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_1f0,
                 (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
      if (!bVar1) {
        testing::Message::Message(&local_1f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__7.message_,(internal *)local_1f0,(AssertionResult *)0x84bde6
                   ,"false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_200,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x4c4,pcVar3);
        testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
        testing::internal::AssertHelper::~AssertHelper(&local_200);
        std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
        testing::Message::~Message(&local_1f8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        local_234 = BN_abs_is_word(pbVar4,0x2a);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_230,&local_234,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
        if (!bVar1) {
          testing::Message::Message(&local_240);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__8.message_,(internal *)local_230,
                     (AssertionResult *)"BN_abs_is_word(bn.get(), 42)","false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_248,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x4c5,pcVar3);
          testing::internal::AssertHelper::operator=(&local_248,&local_240);
          testing::internal::AssertHelper::~AssertHelper(&local_248);
          std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
          testing::Message::~Message(&local_240);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
        pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        local_27c = BN_is_negative(pbVar4);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_278,&local_27c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
        if (!bVar1) {
          testing::Message::Message(&local_288);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_2b0,(internal *)local_278,(AssertionResult *)0x84bce9,"false","true",
                     in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_290,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x4c6,pcVar3);
          testing::internal::AssertHelper::operator=(&local_290,&local_288);
          testing::internal::AssertHelper::~AssertHelper(&local_290);
          std::__cxx11::string::~string((string *)&local_2b0);
          testing::Message::~Message(&local_288);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
        ASCIIToBIGNUM((anon_unknown_dwarf_22460c *)&gtest_ar__9.message_,"0x1234");
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::operator=
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
                   (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__9.message_);
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__9.message_);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_2c8,
                   (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0
                  );
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
        if (!bVar1) {
          testing::Message::Message(&local_2d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__10.message_,(internal *)local_2c8,
                     (AssertionResult *)0x84bde6,"false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2d8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x4c9,pcVar3);
          testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
          testing::internal::AssertHelper::~AssertHelper(&local_2d8);
          std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
          testing::Message::~Message(&local_2d0);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
          ;
          local_30c = BN_is_word(pbVar4,0x1234);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_308,&local_30c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
          if (!bVar1) {
            testing::Message::Message(&local_318);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__11.message_,(internal *)local_308,
                       (AssertionResult *)"BN_is_word(bn.get(), 0x1234)","false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_320,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x4ca,pcVar3);
            testing::internal::AssertHelper::operator=(&local_320,&local_318);
            testing::internal::AssertHelper::~AssertHelper(&local_320);
            std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
            testing::Message::~Message(&local_318);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
          pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
          ;
          iVar2 = BN_is_negative(pbVar4);
          local_351 = iVar2 == 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_350,&local_351,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
          if (!bVar1) {
            testing::Message::Message(&local_360);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_388,(internal *)local_350,(AssertionResult *)0x84bce9,"true","false",
                       in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_368,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x4cb,pcVar3);
            testing::internal::AssertHelper::operator=(&local_368,&local_360);
            testing::internal::AssertHelper::~AssertHelper(&local_368);
            std::__cxx11::string::~string((string *)&local_388);
            testing::Message::~Message(&local_360);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
          ASCIIToBIGNUM((anon_unknown_dwarf_22460c *)&gtest_ar__12.message_,"0X1234");
          std::unique_ptr<bignum_st,_bssl::internal::Deleter>::operator=
                    ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
                     (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__12.message_);
          std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__12.message_);
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_3a0,
                     (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
          if (!bVar1) {
            testing::Message::Message(&local_3a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__13.message_,(internal *)local_3a0,
                       (AssertionResult *)0x84bde6,"false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_3b0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x4ce,pcVar3);
            testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
            testing::internal::AssertHelper::~AssertHelper(&local_3b0);
            std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
            testing::Message::~Message(&local_3a8);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            local_3e4 = BN_is_word(pbVar4,0x1234);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_3e0,&local_3e4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
            if (!bVar1) {
              testing::Message::Message(&local_3f0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__14.message_,(internal *)local_3e0,
                         (AssertionResult *)"BN_is_word(bn.get(), 0x1234)","false","true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_3f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x4cf,pcVar3);
              testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
              testing::internal::AssertHelper::~AssertHelper(&local_3f8);
              std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
              testing::Message::~Message(&local_3f0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
            pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            iVar2 = BN_is_negative(pbVar4);
            local_429 = iVar2 == 0;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_428,&local_429,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
            if (!bVar1) {
              testing::Message::Message(&local_438);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_460,(internal *)local_428,(AssertionResult *)0x84bce9,"true","false"
                         ,in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_440,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x4d0,pcVar3);
              testing::internal::AssertHelper::operator=(&local_440,&local_438);
              testing::internal::AssertHelper::~AssertHelper(&local_440);
              std::__cxx11::string::~string((string *)&local_460);
              testing::Message::~Message(&local_438);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
            ASCIIToBIGNUM((anon_unknown_dwarf_22460c *)&gtest_ar__15.message_,"-0xabcd");
            std::unique_ptr<bignum_st,_bssl::internal::Deleter>::operator=
                      ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
                       (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__15.message_);
            std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__15.message_);
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                      ((AssertionResult *)local_478,
                       (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
                       (type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
            if (!bVar1) {
              testing::Message::Message(&local_480);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__16.message_,(internal *)local_478,
                         (AssertionResult *)0x84bde6,"false","true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_488,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x4d3,pcVar3);
              testing::internal::AssertHelper::operator=(&local_488,&local_480);
              testing::internal::AssertHelper::~AssertHelper(&local_488);
              std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
              testing::Message::~Message(&local_480);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              local_4bc = BN_abs_is_word(pbVar4,0xabcd);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_4b8,&local_4bc,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
              if (!bVar1) {
                testing::Message::Message(&local_4c8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__17.message_,(internal *)local_4b8,
                           (AssertionResult *)"BN_abs_is_word(bn.get(), 0xabcd)","false","true",
                           in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_4d0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x4d4,pcVar3);
                testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
                testing::internal::AssertHelper::~AssertHelper(&local_4d0);
                std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
                testing::Message::~Message(&local_4c8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
              pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              iVar2 = BN_is_negative(pbVar4);
              local_501 = iVar2 != 0;
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_500,&local_501,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
              if (!bVar1) {
                testing::Message::Message(&local_510);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_538,(internal *)local_500,
                           (AssertionResult *)"!BN_is_negative(bn.get())","true","false",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_518,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x4d5,pcVar3);
                testing::internal::AssertHelper::operator=(&local_518,&local_510);
                testing::internal::AssertHelper::~AssertHelper(&local_518);
                std::__cxx11::string::~string((string *)&local_538);
                testing::Message::~Message(&local_510);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
              ASCIIToBIGNUM((anon_unknown_dwarf_22460c *)&gtest_ar__18.message_,"-0");
              std::unique_ptr<bignum_st,_bssl::internal::Deleter>::operator=
                        ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
                         (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__18.message_);
              std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__18.message_);
              testing::AssertionResult::
              AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                        ((AssertionResult *)local_550,
                         (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
                         (type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
              if (!bVar1) {
                testing::Message::Message(&local_558);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__19.message_,(internal *)local_550,
                           (AssertionResult *)0x84bde6,"false","true",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_560,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x4d8,pcVar3);
                testing::internal::AssertHelper::operator=(&local_560,&local_558);
                testing::internal::AssertHelper::~AssertHelper(&local_560);
                std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
                testing::Message::~Message(&local_558);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                local_594 = BN_is_zero(pbVar4);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_590,&local_594,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_590);
                if (!bVar1) {
                  testing::Message::Message(&local_5a0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__20.message_,(internal *)local_590,
                             (AssertionResult *)"BN_is_zero(bn.get())","false","true",in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_5a8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x4d9,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
                  testing::internal::AssertHelper::~AssertHelper(&local_5a8);
                  std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
                  testing::Message::~Message(&local_5a0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
                pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                iVar2 = BN_is_negative(pbVar4);
                local_5d9 = iVar2 == 0;
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_5d8,&local_5d9,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_5d8);
                if (!bVar1) {
                  testing::Message::Message(&local_5e8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_610,(internal *)local_5d8,(AssertionResult *)0x84bce9,"true",
                             "false",in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_5f0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x4da,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_5f0,&local_5e8);
                  testing::internal::AssertHelper::~AssertHelper(&local_5f0);
                  std::__cxx11::string::~string((string *)&local_610);
                  testing::Message::~Message(&local_5e8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
                ASCIIToBIGNUM((anon_unknown_dwarf_22460c *)&gtest_ar__21.message_,
                              "123trailing garbage is ignored");
                std::unique_ptr<bignum_st,_bssl::internal::Deleter>::operator=
                          ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
                           (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__21.message_)
                ;
                std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__21.message_)
                ;
                testing::AssertionResult::
                AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                          ((AssertionResult *)local_628,
                           (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
                           (type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_628);
                if (!bVar1) {
                  testing::Message::Message(&local_630);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__22.message_,(internal *)local_628,
                             (AssertionResult *)0x84bde6,"false","true",in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_638,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x4dd,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_638,&local_630);
                  testing::internal::AssertHelper::~AssertHelper(&local_638);
                  std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
                  testing::Message::~Message(&local_630);
                }
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_628);
                if (gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                      &gtest_ar_.message_);
                  local_66c = BN_is_word(pbVar4,0x7b);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_668,&local_66c,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_668);
                  if (!bVar1) {
                    testing::Message::Message(&local_678);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__23.message_,(internal *)local_668,
                               (AssertionResult *)"BN_is_word(bn.get(), 123)","false","true",in_R9);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_680,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x4de,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_680,&local_678);
                    testing::internal::AssertHelper::~AssertHelper(&local_680);
                    std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
                    testing::Message::~Message(&local_678);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
                  pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                      &gtest_ar_.message_);
                  iVar2 = BN_is_negative(pbVar4);
                  local_6b1 = iVar2 == 0;
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_6b0,&local_6b1,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_6b0);
                  if (!bVar1) {
                    testing::Message::Message(&local_6c0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_6e8,(internal *)local_6b0,(AssertionResult *)0x84bce9,"true",
                               "false",in_R9);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_6c8,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x4df,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_6c8,&local_6c0);
                    testing::internal::AssertHelper::~AssertHelper(&local_6c8);
                    std::__cxx11::string::~string((string *)&local_6e8);
                    testing::Message::~Message(&local_6c0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(BNTest, ASC2BN) {
  bssl::UniquePtr<BIGNUM> bn = ASCIIToBIGNUM("0");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_zero(bn.get()));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("256");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_word(bn.get(), 256));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("-42");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_abs_is_word(bn.get(), 42));
  EXPECT_TRUE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("0x1234");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_word(bn.get(), 0x1234));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("0X1234");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_word(bn.get(), 0x1234));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("-0xabcd");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_abs_is_word(bn.get(), 0xabcd));
  EXPECT_FALSE(!BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("-0");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_zero(bn.get()));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("123trailing garbage is ignored");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_word(bn.get(), 123));
  EXPECT_FALSE(BN_is_negative(bn.get()));
}